

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O3

void __thiscall
boost::ext::ut::v1_1_8::runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16>
::on<void(*)(),boost::ext::ut::v1_1_8::none>
          (runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16> *this,
          test<void_(*)(),_boost::ext::ut::v1_1_8::none> *test)

{
  ostream *poVar1;
  runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16> *prVar2;
  long lVar3;
  pointer psVar4;
  string_view *psVar5;
  test_end tVar6;
  bool bVar7;
  undefined7 extraout_var;
  uint uVar8;
  char *pcVar9;
  string_view *tag;
  pointer psVar10;
  iterator __end0;
  ulong uVar11;
  basic_string_view<char,_std::char_traits<char>_> *ftag;
  string_view *psVar12;
  string_view input;
  string_view input_00;
  string_view pattern;
  char local_69;
  test<void_(*)(),_boost::ext::ut::v1_1_8::none> *local_68;
  uint local_5c;
  char *local_58;
  unsigned_long uStack_50;
  char *pcStack_48;
  unsigned_long uStack_40;
  
  lVar3 = *(long *)(this + 0x200);
  pcVar9 = (test->name).data_;
  *(unsigned_long *)(this + lVar3 * 0x10 + 0x218) = (test->name).size_;
  *(char **)(this + lVar3 * 0x10 + 0x220) = pcVar9;
  psVar10 = (test->tag).
            super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (test->tag).
           super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_68 = test;
  if (psVar10 != psVar4) {
    local_5c = 0;
    do {
      input._M_str = psVar10->data_;
      input._M_len = psVar10->size_;
      pattern._M_str = "skip";
      pattern._M_len = 4;
      bVar7 = utility::is_match(input,pattern);
      if (bVar7) goto LAB_0011b07a;
      psVar5 = *(string_view **)(this + 0x338);
      for (psVar12 = *(string_view **)(this + 0x330); psVar12 != psVar5; psVar12 = psVar12 + 1) {
        input_00._M_str = psVar10->data_;
        input_00._M_len = psVar10->size_;
        bVar7 = utility::is_match(input_00,*psVar12);
        if (bVar7) {
          local_5c = (uint)CONCAT71(extraout_var,1);
          break;
        }
      }
      psVar10 = psVar10 + 1;
    } while (psVar10 != psVar4);
    if ((local_5c & 1) == 0) {
LAB_0011b07a:
      std::ostream::write((char *)(this + 0x70),(long)(local_68->name).data_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(this + 0x70),"...SKIPPED\n",0xb);
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      return;
    }
  }
  bVar7 = filter::operator()(this + 0x318,*(size_t *)(this + 0x200),
                             (array<std::basic_string_view<char,_std::char_traits<char>_>,_16UL> *)
                             (this + 0x218));
  if (bVar7) {
    lVar3 = *(long *)(this + 0x200);
    poVar1 = (ostream *)(this + 0x70);
    *(long *)(this + 0x200) = lVar3 + 1;
    pcVar9 = (local_68->name).data_;
    if (lVar3 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Running \"",9);
      std::ostream::write((char *)poVar1,(long)pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"...",4);
      *(undefined8 *)(this + 0x28) = *(undefined8 *)(this + 0x20);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n \"",3);
      std::ostream::write((char *)poVar1,(long)pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"...",4);
    }
    if (this[0x348] ==
        (runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16>)0x1) {
      if (*(long *)(this + 0x200) != 0) {
        uVar8 = 1;
        uVar11 = 0;
        do {
          pcVar9 = "";
          if (uVar8 != 1) {
            pcVar9 = ".";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,pcVar9,(ulong)(uVar8 != 1));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,*(char **)(this + uVar11 * 0x10 + 0x220),
                     *(long *)(this + 0x218 + uVar11 * 0x10));
          uVar11 = (ulong)uVar8;
          uVar8 = uVar8 + 1;
        } while (uVar11 < *(ulong *)(this + 0x200));
      }
      local_69 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_69,1);
    }
    (*local_68->run)();
    prVar2 = this + 0x200;
    *(long *)prVar2 = *(long *)prVar2 + -1;
    if (*(long *)prVar2 == 0) {
      local_58 = (local_68->type).data_;
      uStack_50 = (local_68->type).size_;
      pcStack_48 = (local_68->name).data_;
      uStack_40 = (local_68->name).size_;
      tVar6.type = local_68->type;
      tVar6.name = local_68->name;
      reporter<boost::ext::ut::v1_1_8::printer>::on
                ((reporter<boost::ext::ut::v1_1_8::printer> *)this,tVar6);
    }
  }
  return;
}

Assistant:

auto on(events::test<Ts...> test) {
      path_[level_] = test.name;

      auto execute = std::empty(test.tag);
      for (const auto& tag : test.tag) {
        if (utility::is_match(tag, "skip")) {
          on(events::skip<>{.type = test.type, .name = test.name});
          return;
        }

        for (const auto& ftag : tag_) {
          if (utility::is_match(tag, ftag)) {
            execute = true;
            break;
          }
        }
      }

      if (not execute) {
        on(events::skip<>{.type = test.type, .name = test.name});
        return;
      }

      if (filter_(level_, path_)) {
        if (not level_++) {
          reporter_.on(events::test_begin{
              .type = test.type, .name = test.name, .location = test.location});
        } else {
          reporter_.on(events::test_run{.type = test.type, .name = test.name});
        }

        if (dry_run_) {
          for (auto i = 0u; i < level_; ++i) {
            std::cout << (i ? "." : "") << path_[i];
          }
          std::cout << '\n';
        }

#if defined(__cpp_exceptions)
        try {
#endif
          test();
#if defined(__cpp_exceptions)
        } catch (const events::fatal_assertion&) {
        } catch (const std::exception& exception) {
          ++fails_;
          reporter_.on(events::exception{exception.what()});
        } catch (...) {
          ++fails_;
          reporter_.on(events::exception{"Unknown exception"});
        }
#endif

        if (not--level_) {
          reporter_.on(events::test_end{.type = test.type, .name = test.name});
        }
      }
    }